

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualRow.cpp
# Opt level: O0

void __thiscall HEkkDualRow::deleteFreelist(HEkkDualRow *this,HighsInt iVar)

{
  bool bVar1;
  size_type sVar2;
  undefined4 in_ESI;
  key_type_conflict1 *in_RDI;
  set<int,_std::less<int>,_std::allocator<int>_> *unaff_retaddr;
  undefined4 in_stack_fffffffffffffff0;
  key_type_conflict1 *__x;
  
  __x = in_RDI;
  bVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::empty
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)0x7a1a1f);
  if ((!bVar1) &&
     (sVar2 = std::set<int,_std::less<int>,_std::allocator<int>_>::count(unaff_retaddr,__x),
     sVar2 != 0)) {
    std::set<int,_std::less<int>,_std::allocator<int>_>::erase
              ((set<int,_std::less<int>,_std::allocator<int>_> *)
               CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDI);
  }
  return;
}

Assistant:

void HEkkDualRow::deleteFreelist(HighsInt iVar) {
  if (!freeList.empty()) {
    if (freeList.count(iVar)) freeList.erase(iVar);
  }
}